

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::opt::GraphicsRobustAccessPass::IsCompatibleModule(GraphicsRobustAccessPass *this)

{
  __uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
  this_00;
  bool bVar1;
  uint32_t uVar2;
  FeatureManager *pFVar3;
  char *pcVar4;
  CapabilitySet *this_01;
  string sStack_218;
  DiagnosticStream local_1f8;
  
  pFVar3 = IRContext::get_feature_mgr((this->super_Pass).context_);
  this_01 = &pFVar3->capabilities_;
  bVar1 = EnumSet<spv::Capability>::contains(this_01,Shader);
  if (bVar1) {
    bVar1 = EnumSet<spv::Capability>::contains(this_01,VariablePointers);
    if (bVar1) {
      Fail(&local_1f8,this);
      pcVar4 = "Can\'t process modules with VariablePointers capability";
    }
    else {
      bVar1 = EnumSet<spv::Capability>::contains(this_01,VariablePointersStorageBuffer);
      if (bVar1) {
        Fail(&local_1f8,this);
        pcVar4 = "Can\'t process modules with VariablePointersStorageBuffer capability";
      }
      else {
        bVar1 = EnumSet<spv::Capability>::contains(this_01,RuntimeDescriptorArray);
        if (!bVar1) {
          this_00.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
               (((((this->super_Pass).context_)->module_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                 .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->memory_model_
               )._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ;
          uVar2 = Instruction::GetSingleWordOperand
                            ((Instruction *)
                             this_00.
                             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                             _M_head_impl,0);
          if (uVar2 == 0) {
            return SPV_SUCCESS;
          }
          Fail(&local_1f8,this);
          std::operator<<((ostream *)&local_1f8,"Addressing model must be Logical.  Found ");
          Instruction::PrettyPrint_abi_cxx11_
                    (&sStack_218,
                     (Instruction *)
                     this_00.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,0);
          std::operator<<((ostream *)&local_1f8,(string *)&sStack_218);
          std::__cxx11::string::_M_dispose();
          goto LAB_001f0360;
        }
        Fail(&local_1f8,this);
        pcVar4 = "Can\'t process modules with RuntimeDescriptorArrayEXT capability";
      }
    }
  }
  else {
    Fail(&local_1f8,this);
    pcVar4 = "Can only process Shader modules";
  }
  std::operator<<((ostream *)&local_1f8,pcVar4);
LAB_001f0360:
  DiagnosticStream::~DiagnosticStream(&local_1f8);
  return local_1f8.error_;
}

Assistant:

spv_result_t GraphicsRobustAccessPass::IsCompatibleModule() {
  auto* feature_mgr = context()->get_feature_mgr();
  if (!feature_mgr->HasCapability(spv::Capability::Shader))
    return Fail() << "Can only process Shader modules";
  if (feature_mgr->HasCapability(spv::Capability::VariablePointers))
    return Fail() << "Can't process modules with VariablePointers capability";
  if (feature_mgr->HasCapability(
          spv::Capability::VariablePointersStorageBuffer))
    return Fail() << "Can't process modules with VariablePointersStorageBuffer "
                     "capability";
  if (feature_mgr->HasCapability(spv::Capability::RuntimeDescriptorArrayEXT)) {
    // These have a RuntimeArray outside of Block-decorated struct.  There
    // is no way to compute the array length from within SPIR-V.
    return Fail() << "Can't process modules with RuntimeDescriptorArrayEXT "
                     "capability";
  }

  {
    auto* inst = context()->module()->GetMemoryModel();
    const auto addressing_model =
        spv::AddressingModel(inst->GetSingleWordOperand(0));
    if (addressing_model != spv::AddressingModel::Logical)
      return Fail() << "Addressing model must be Logical.  Found "
                    << inst->PrettyPrint();
  }
  return SPV_SUCCESS;
}